

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall
soul::StructuralParser::giveErrorOnAssignmentToProcessorProperty(StructuralParser *this)

{
  bool bVar1;
  Context context;
  Context local_90;
  CompileMessage local_78;
  CompileMessage local_40;
  
  getContext(&local_90,this);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c4fee);
  if (bVar1) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x29da52);
    if (bVar1) {
      parseProcessorProperty(this);
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)0x2a3521);
      if (bVar1) {
        Errors::cannotAssignToProcessorProperties<>();
        AST::Context::throwError(&local_90,&local_40,false);
      }
      Errors::expectedStatement<>();
      AST::Context::throwError(&local_90,&local_78,false);
    }
  }
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_90);
  return;
}

Assistant:

void giveErrorOnAssignmentToProcessorProperty()
    {
        auto context = getContext();

        if (matchIf (Keyword::processor) && matches (Operator::dot))
        {
            ignoreUnused (parseProcessorProperty());

            if (matches (Operator::assign))
                context.throwError (Errors::cannotAssignToProcessorProperties());

            context.throwError (Errors::expectedStatement());
        }
    }